

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O1

char * path_direction(wchar_t feat)

{
  char *pcVar1;
  
  pcVar1 = "north";
  if (((((FEAT_LESS_NORTH != feat) && (FEAT_MORE_NORTH != feat)) &&
       (pcVar1 = "east", FEAT_LESS_EAST != feat)) &&
      ((FEAT_MORE_EAST != feat && (pcVar1 = "south", FEAT_LESS_SOUTH != feat)))) &&
     ((FEAT_MORE_SOUTH != feat &&
      ((pcVar1 = "west", FEAT_LESS_WEST != feat && (FEAT_MORE_WEST != feat)))))) {
    if (FEAT_LESS == feat) {
      return "up";
    }
    pcVar1 = "";
    if (FEAT_MORE == feat) {
      pcVar1 = "down";
    }
  }
  return pcVar1;
}

Assistant:

static const char *path_direction(int feat)
{
	if (feat == FEAT_LESS_NORTH) return "north";
	if (feat == FEAT_MORE_NORTH) return "north";
	if (feat == FEAT_LESS_EAST) return "east";
	if (feat == FEAT_MORE_EAST) return "east";
	if (feat == FEAT_LESS_SOUTH) return "south";
	if (feat == FEAT_MORE_SOUTH) return "south";
	if (feat == FEAT_LESS_WEST) return "west";
	if (feat == FEAT_MORE_WEST) return "west";
	if (feat == FEAT_LESS) return "up";
	if (feat == FEAT_MORE) return "down";
	return "";
}